

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm.cc
# Opt level: O0

bool __thiscall
bssl::ParseAlgorithmIdentifier(bssl *this,Input input,Input *algorithm,Input *parameters)

{
  Input input_00;
  bool bVar1;
  Input local_80;
  undefined1 local_70 [8];
  Parser algorithm_identifier_parser;
  undefined1 local_48 [8];
  Parser parser;
  Input *parameters_local;
  Input *algorithm_local;
  Input input_local;
  
  input_00.data_.size_ = (size_t)input.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  algorithm_identifier_parser.advance_len_ = (size_t)this;
  parser.advance_len_ = (size_t)algorithm;
  der::Parser::Parser((Parser *)local_48,input_00);
  der::Parser::Parser((Parser *)local_70);
  bVar1 = der::Parser::ReadSequence((Parser *)local_48,(Parser *)local_70);
  if (bVar1) {
    bVar1 = der::Parser::HasMore((Parser *)local_48);
    if (bVar1) {
      input_local.data_.size_._7_1_ = false;
    }
    else {
      bVar1 = der::Parser::ReadTag((Parser *)local_70,6,(Input *)input.data_.size_);
      if (bVar1) {
        memset(&local_80,0,0x10);
        der::Input::Input(&local_80);
        *(uchar **)parser.advance_len_ = local_80.data_.data_;
        *(size_t *)(parser.advance_len_ + 8) = local_80.data_.size_;
        bVar1 = der::Parser::HasMore((Parser *)local_70);
        if ((!bVar1) ||
           (bVar1 = der::Parser::ReadRawTLV((Parser *)local_70,(Input *)parser.advance_len_), bVar1)
           ) {
          bVar1 = der::Parser::HasMore((Parser *)local_70);
          input_local.data_.size_._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
        else {
          input_local.data_.size_._7_1_ = false;
        }
      }
      else {
        input_local.data_.size_._7_1_ = false;
      }
    }
  }
  else {
    input_local.data_.size_._7_1_ = false;
  }
  return input_local.data_.size_._7_1_;
}

Assistant:

[[nodiscard]] bool ParseAlgorithmIdentifier(der::Input input,
                                            der::Input *algorithm,
                                            der::Input *parameters) {
  der::Parser parser(input);

  der::Parser algorithm_identifier_parser;
  if (!parser.ReadSequence(&algorithm_identifier_parser)) {
    return false;
  }

  // There shouldn't be anything after the sequence. This is by definition,
  // as the input to this function is expected to be a single
  // AlgorithmIdentifier.
  if (parser.HasMore()) {
    return false;
  }

  if (!algorithm_identifier_parser.ReadTag(CBS_ASN1_OBJECT, algorithm)) {
    return false;
  }

  // Read the optional parameters to a der::Input. The parameters can be at
  // most one TLV (for instance NULL or a sequence).
  //
  // Note that nothing is allowed after the single optional "parameters" TLV.
  // This is because RFC 5912's notation for AlgorithmIdentifier doesn't
  // explicitly list an extension point after "parameters".
  *parameters = der::Input();
  if (algorithm_identifier_parser.HasMore() &&
      !algorithm_identifier_parser.ReadRawTLV(parameters)) {
    return false;
  }
  return !algorithm_identifier_parser.HasMore();
}